

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::extract_binary_string(string *escaped_string)

{
  char hc;
  char hc_00;
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  long lVar4;
  char *pcVar5;
  string *in_RSI;
  string *in_RDI;
  uint32_t res2;
  uint32_t res1;
  value_type c2;
  value_type c1;
  size_t loc;
  size_t ssize;
  size_t tail;
  size_t start;
  string *outstring;
  ulong local_48;
  long local_20;
  ulong local_18;
  
  local_18 = 0;
  local_20 = 0;
  lVar4 = ::std::__cxx11::string::size();
  iVar1 = ::std::__cxx11::string::compare((ulong)in_RSI,0,(char *)0x3);
  if ((iVar1 == 0) &&
     (iVar1 = ::std::__cxx11::string::compare((ulong)in_RSI,lVar4 - 2,(char *)0x2), iVar1 == 0)) {
    local_18 = 3;
    local_20 = 2;
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((ulong)in_RSI,0,(char *)0x4);
    if ((iVar1 == 0) &&
       (iVar1 = ::std::__cxx11::string::compare((ulong)in_RSI,lVar4 - 3,(char *)0x3), iVar1 == 0)) {
      local_18 = 4;
      local_20 = 3;
    }
  }
  if (local_18 == 0) {
    ::std::__cxx11::string::string((string *)in_RDI,in_RSI);
    return in_RDI;
  }
  ::std::__cxx11::string::string((string *)in_RDI);
  ::std::__cxx11::string::reserve((ulong)in_RDI);
  local_48 = local_18;
  do {
    while( true ) {
      if ((ulong)(lVar4 - local_20) <= local_48) {
        return in_RDI;
      }
      pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)in_RSI);
      if ((*pcVar5 == '\\') &&
         ((pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)in_RSI), *pcVar5 == 'x' ||
          (pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)in_RSI), *pcVar5 == 'X'))))
      break;
LAB_00135768:
      ::std::__cxx11::string::operator[]((ulong)in_RSI);
      ::std::__cxx11::string::push_back((char)in_RDI);
      local_48 = local_48 + 1;
    }
    pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)in_RSI);
    hc = *pcVar5;
    pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)in_RSI);
    hc_00 = *pcVar5;
    uVar2 = hexConvert(hc);
    uVar3 = hexConvert(hc_00);
    if ((0xf < uVar2) || (0xf < uVar3)) goto LAB_00135768;
    local_48 = local_48 + 4;
    ::std::__cxx11::string::push_back((char)in_RDI);
  } while( true );
}

Assistant:

CLI11_INLINE std::string extract_binary_string(const std::string &escaped_string) {
    std::size_t start{0};
    std::size_t tail{0};
    size_t ssize = escaped_string.size();
    if(escaped_string.compare(0, 3, "B\"(") == 0 && escaped_string.compare(ssize - 2, 2, ")\"") == 0) {
        start = 3;
        tail = 2;
    } else if(escaped_string.compare(0, 4, "'B\"(") == 0 && escaped_string.compare(ssize - 3, 3, ")\"'") == 0) {
        start = 4;
        tail = 3;
    }

    if(start == 0) {
        return escaped_string;
    }
    std::string outstring;

    outstring.reserve(ssize - start - tail);
    std::size_t loc = start;
    while(loc < ssize - tail) {
        // ssize-2 to skip )" at the end
        if(escaped_string[loc] == '\\' && (escaped_string[loc + 1] == 'x' || escaped_string[loc + 1] == 'X')) {
            auto c1 = escaped_string[loc + 2];
            auto c2 = escaped_string[loc + 3];

            std::uint32_t res1 = hexConvert(c1);
            std::uint32_t res2 = hexConvert(c2);
            if(res1 <= 0x0F && res2 <= 0x0F) {
                loc += 4;
                outstring.push_back(static_cast<char>(res1 * 16 + res2));
                continue;
            }
        }
        outstring.push_back(escaped_string[loc]);
        ++loc;
    }
    return outstring;
}